

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O1

int testFileWriterTestsWriteToFile(void)

{
  float *pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer puVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  uint uVar8;
  unsigned_long size;
  SpanSize<18446744073709551615UL> SVar9;
  size_t sVar10;
  pointer pfVar11;
  float *pfVar12;
  SpanSize<18446744073709551615UL> in_R8;
  difference_type __d2;
  pointer ptVar13;
  pointer ptVar14;
  uchar *ptr;
  float *pfVar15;
  undefined1 auVar16 [8];
  pointer __s1;
  uchar *ptr_2;
  void *pvVar17;
  bool bVar18;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  initializer_list<unsigned_char> __l_00;
  Span<const_unsigned_char,_18446744073709551615UL> data_00;
  initializer_list<float> __l_01;
  Span<const_unsigned_char,_18446744073709551615UL> data_01;
  initializer_list<unsigned_char> __l_02;
  Span<unsigned_char,_18446744073709551615UL> data_02;
  Span<unsigned_char,_18446744073709551615UL> data_03;
  Span<float,_18446744073709551615UL> data_04;
  Span<unsigned_char,_18446744073709551615UL> data_05;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> oldExpected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> outputOld;
  AutoDeleteTempFile tempfile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  allocator_type local_2b9;
  vector<float,_std::allocator<float>_> local_2b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  AutoDeleteTempFile local_270;
  undefined1 local_248 [8];
  pointer pfStack_240;
  undefined4 local_238;
  undefined4 uStack_234;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_270);
  local_248._0_4_ = 0x281e140a;
  __l._M_len = 4;
  __l._M_array = local_248;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2b8,__l,
             (allocator_type *)&local_2a0);
  pfVar3 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar2 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  SVar9.m_size = (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
  pfVar15 = (float *)0x0;
  if (SVar9.m_size != 0) {
    pfVar15 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  psVar6 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_248,psVar6,true);
  pfVar11 = pfVar2;
  if (pfVar3 == pfVar2) {
    pfVar11 = (float *)0x0;
  }
  data.m_size.m_size = SVar9.m_size;
  data.m_ptr = (pointer)pfVar11;
  MILBlob::Blob::FileWriter::WriteData((FileWriter *)local_248,data,0);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_248);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
             (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator_type *)&local_2a0);
  ptVar13 = (pointer)((long)pfStack_240 - (long)local_248);
  auVar16 = (undefined1  [8])(float *)0x0;
  if (ptVar13 != (pointer)0x0) {
    auVar16 = local_248;
  }
  psVar6 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
  data_02.m_size.m_size = in_R8.m_size;
  data_02.m_ptr = ptVar13;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)psVar6,(string *)0x0,(uint64_t)auVar16,data_02);
  if ((pointer)SVar9.m_size == ptVar13) {
    if (pfVar3 == pfVar2) {
      bVar18 = true;
    }
    else {
      iVar5 = bcmp(pfVar15,(void *)auVar16,SVar9.m_size);
      bVar18 = iVar5 == 0;
    }
  }
  else {
    bVar18 = false;
  }
  if (!bVar18) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_248 != (undefined1  [8])0x0) {
      operator_delete((void *)local_248,CONCAT44(uStack_234,local_238) - (long)local_248);
    }
    if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar8 = 1;
    goto LAB_001c7371;
  }
  if (local_248 != (undefined1  [8])0x0) {
    operator_delete((void *)local_248,CONCAT44(uStack_234,local_238) - (long)local_248);
  }
  if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_248._0_4_ = 0x281e140a;
  __l_00._M_len = 4;
  __l_00._M_array = local_248;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2b8,__l_00,
             (allocator_type *)&local_2a0);
  pfVar3 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar2 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  SVar9.m_size = (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
  pfVar15 = (float *)0x0;
  if (SVar9.m_size != 0) {
    pfVar15 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  psVar6 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_248,psVar6,false);
  pfVar11 = pfVar2;
  if (pfVar3 == pfVar2) {
    pfVar11 = (float *)0x0;
  }
  data_00.m_size.m_size = SVar9.m_size;
  data_00.m_ptr = (pointer)pfVar11;
  MILBlob::Blob::FileWriter::WriteData((FileWriter *)local_248,data_00,0);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_248);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
             (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator_type *)&local_2a0);
  ptVar13 = (pointer)((long)pfStack_240 - (long)local_248);
  auVar16 = (undefined1  [8])(float *)0x0;
  if (ptVar13 != (pointer)0x0) {
    auVar16 = local_248;
  }
  psVar6 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
  data_03.m_size.m_size = in_R8.m_size;
  data_03.m_ptr = ptVar13;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)psVar6,(string *)0x0,(uint64_t)auVar16,data_03);
  if ((pointer)SVar9.m_size == ptVar13) {
    if (pfVar3 == pfVar2) {
      bVar18 = true;
    }
    else {
      iVar5 = bcmp(pfVar15,(void *)auVar16,SVar9.m_size);
      bVar18 = iVar5 == 0;
    }
  }
  else {
    bVar18 = false;
  }
  if (!bVar18) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_248 != (undefined1  [8])0x0) {
      operator_delete((void *)local_248,CONCAT44(uStack_234,local_238) - (long)local_248);
    }
    if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar8 = 1;
    goto LAB_001c7371;
  }
  if (local_248 != (undefined1  [8])0x0) {
    operator_delete((void *)local_248,CONCAT44(uStack_234,local_238) - (long)local_248);
  }
  if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_248 = (undefined1  [8])0x40b591683f9e147b;
  pfStack_240 = (pointer)0x445eda3d44208000;
  local_238 = 0x465cb08f;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)local_248;
  std::vector<float,_std::allocator<float>_>::vector(&local_2b8,__l_01,(allocator_type *)&local_2a0)
  ;
  pfVar3 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar2 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  SVar9.m_size = (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
  pfVar15 = (float *)0x0;
  if (SVar9.m_size != 0) {
    pfVar15 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  psVar6 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_248,psVar6,false);
  pfVar12 = (float *)0x0;
  if (pfVar3 != pfVar2) {
    pfVar12 = pfVar2;
  }
  data_01.m_size.m_size = SVar9.m_size;
  data_01.m_ptr = (pointer)pfVar12;
  MILBlob::Blob::FileWriter::WriteData((FileWriter *)local_248,data_01,0x40);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_248);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_248,
             (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_2a0);
  sVar10 = (long)pfStack_240 - (long)local_248;
  auVar16 = (undefined1  [8])(float *)0x0;
  if (sVar10 != 0) {
    auVar16 = local_248;
  }
  psVar6 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
  data_04.m_ptr = (pointer)((long)sVar10 >> 2);
  data_04.m_size.m_size = in_R8.m_size;
  MILBlob::TestUtil::ReadBlobFile<float>
            ((TestUtil *)psVar6,(string *)0x40,(uint64_t)auVar16,data_04);
  if (SVar9.m_size == sVar10) {
    bVar18 = pfVar3 == pfVar2;
    if (!bVar18) {
      if ((*pfVar15 == *(float *)auVar16) && (!NAN(*pfVar15) && !NAN(*(float *)auVar16))) {
        sVar10 = 4;
        do {
          bVar18 = SVar9.m_size == sVar10;
          if (bVar18) goto LAB_001c71e8;
          pfVar12 = (float *)((long)pfVar15 + sVar10);
          pfVar1 = (float *)((long)auVar16 + sVar10);
          sVar10 = sVar10 + 4;
        } while ((*pfVar12 == *pfVar1) && (!NAN(*pfVar12) && !NAN(*pfVar1)));
      }
      goto LAB_001c7291;
    }
LAB_001c71e8:
    if (!bVar18) goto LAB_001c7291;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x281e140a;
    __l_02._M_len = 4;
    __l_02._M_array = (iterator)&local_288;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2a0,__l_02,&local_2b9)
    ;
    puVar4 = local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar13 = local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              -(long)local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    __s1 = (pointer)0x0;
    if (ptVar13 != (pointer)0x0) {
      __s1 = local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_288,(size_type)ptVar13,&local_2b9);
    ptVar14 = local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              -(long)CONCAT44(local_288.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_288.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    pvVar17 = (void *)0x0;
    if (ptVar14 != (pointer)0x0) {
      pvVar17 = (void *)CONCAT44(local_288.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_288.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
    }
    psVar6 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
    data_05.m_size.m_size = in_R8.m_size;
    data_05.m_ptr = ptVar14;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)psVar6,(string *)0x0,(uint64_t)pvVar17,data_05);
    if (ptVar13 == ptVar14) {
      if (local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar4) {
        bVar18 = true;
      }
      else {
        iVar5 = bcmp(__s1,pvVar17,(size_t)ptVar13);
        bVar18 = iVar5 == 0;
      }
    }
    else {
      bVar18 = false;
    }
    if (bVar18 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "std::equal(oldExpectedSpan.begin(), oldExpectedSpan.end(), outputOldSpan.begin(), outputOldSpan.end())"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    pvVar17 = (void *)CONCAT44(local_288.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_288.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar17 != (void *)0x0) {
      operator_delete(pvVar17,(long)local_288.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pvVar17);
    }
    if (local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2a0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar8 = (uint)(bVar18 ^ 1);
  }
  else {
LAB_001c7291:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    uVar8 = 1;
    std::ostream::flush();
  }
  if (local_248 != (undefined1  [8])0x0) {
    operator_delete((void *)local_248,CONCAT44(uStack_234,local_238) - (long)local_248);
  }
  if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_001c7371:
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_270);
  return uVar8;
}

Assistant:

int testFileWriterTestsWriteToFile()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 0;
        const std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    // Writing to empty file without truncating
    {
        uint64_t offset = 0;
        const std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    // Writing to existing file without truncating
    {
        uint64_t offset = 64;
        const std::vector<float> expected{1.235f, 5.674f, 642.f, 891.41f, 14124.14f};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<float> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<float>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);

        // Ensure earlier written data is present as well
        const std::vector<uint8_t> oldExpected{10, 20, 30, 40};
        auto oldExpectedSpan = Util::MakeSpan(oldExpected);
        std::vector<uint8_t> outputOld(oldExpected.size());
        auto outputOldSpan = Util::MakeSpan(outputOld);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), 0, outputOldSpan);
        ML_ASSERT_SPAN_EQ(oldExpectedSpan, outputOldSpan);
    }

    return 0;
}